

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

char server::textcmd(char *a,char *text)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  
  sVar3 = strlen(a);
  sVar4 = 0;
  while (sVar3 != sVar4) {
    lVar5 = sVar4 + 1;
    pcVar1 = a + sVar4;
    sVar4 = sVar4 + 1;
    if (text[lVar5] != *pcVar1) {
      return '\0';
    }
  }
  if ((text[sVar3 + 1] & 0xdfU) != 0) {
    lVar5 = 0;
    do {
      iVar2 = strcmp(blkmsg + lVar5,a);
      if (iVar2 != 0) {
        return '\x01';
      }
      lVar5 = lVar5 + 0x104;
    } while (lVar5 != 0x30c);
    return '\0';
  }
  return '\x01';
}

Assistant:

char textcmd(const char *a, const char *text){
        for (int b=0; b<strlen(a); b++) {
            if (text[b+1] != a[b]) {
                return false;
            }
        }
        if(text[strlen(a)+1] != ' ' && text[strlen(a)+1] != '\0') {
            for (int l=0; l<3; l++) {
                if (strcmp(blkmsg[l], a)) {
                    return true;
                    break;
                }
            }
            return false;
        }
        return true;
    }